

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nonrd_pickmode.c
# Opt level: O0

void model_skip_for_sb_y_large
               (AV1_COMP *cpi,BLOCK_SIZE bsize,int mi_row,int mi_col,MACROBLOCK *x,MACROBLOCKD *xd,
               RD_STATS *rd_stats,int *early_term,int calculate_rd,int64_t best_sse,uint *var_output
               ,uint var_prune_threshold)

{
  ulong uVar1;
  int iVar2;
  BLOCK_SIZE in_SIL;
  long in_RDI;
  long in_R8;
  long in_R9;
  undefined4 *in_stack_00000008;
  int *in_stack_00000010;
  int in_stack_00000018;
  int64_t in_stack_00000020;
  uint *in_stack_00000028;
  uint in_stack_00000030;
  uint num_blks;
  uint *var_tx;
  uint *sse_tx;
  uint var16x16 [64];
  int sum16x16 [64];
  uint sse16x16 [64];
  MB_MODE_INFO *mi;
  TX_SIZE tx_size;
  uint var8x8 [256];
  int sum8x8 [256];
  uint sse8x8 [256];
  int bh;
  int bw;
  int sum;
  uint var;
  int test_skip;
  macroblockd_plane *pd;
  macroblock_plane *p;
  uint sse;
  TxfmSearchParams *txfm_params;
  undefined4 local_fd8;
  int *piVar3;
  int calculate_rd_00;
  undefined4 uVar4;
  RD_STATS *rd_stats_00;
  uint in_stack_fffffffffffff048;
  int in_stack_fffffffffffff04c;
  undefined4 uVar5;
  uint in_stack_fffffffffffff054;
  RD_STATS *local_fa8;
  uint in_stack_fffffffffffff060;
  RD_STATS *pRVar6;
  uint local_f98 [2];
  uint *in_stack_fffffffffffff070;
  uint in_stack_fffffffffffff078;
  uint in_stack_fffffffffffff07c;
  int in_stack_fffffffffffff080;
  undefined4 in_stack_fffffffffffff084;
  undefined7 in_stack_fffffffffffff088;
  BLOCK_SIZE in_stack_fffffffffffff08f;
  AV1_COMP *in_stack_fffffffffffff090;
  uint32_t *in_stack_fffffffffffff098;
  int in_stack_fffffffffffff0b0;
  int in_stack_fffffffffffff0b4;
  MACROBLOCKD *in_stack_fffffffffffff0b8;
  BLOCK_SIZE in_stack_fffffffffffff0c7;
  MACROBLOCK *in_stack_fffffffffffff0c8;
  AV1_COMP *in_stack_fffffffffffff0d0;
  int *in_stack_fffffffffffff0e0;
  int in_stack_fffffffffffff0e8;
  uint *in_stack_fffffffffffff0f0;
  uint *in_stack_fffffffffffff0f8;
  int in_stack_fffffffffffff100;
  uint in_stack_fffffffffffff108;
  uint in_stack_fffffffffffff110;
  int local_e98 [64];
  RD_STATS local_d98;
  MACROBLOCKD *in_stack_fffffffffffff2a0;
  MACROBLOCK *in_stack_fffffffffffff2a8;
  int in_stack_fffffffffffff2b4;
  int in_stack_fffffffffffff2b8;
  BLOCK_SIZE in_stack_fffffffffffff2bf;
  AV1_COMP *in_stack_fffffffffffff2c0;
  RD_STATS *in_stack_fffffffffffff2f0;
  int *in_stack_fffffffffffff2f8;
  int in_stack_fffffffffffff300;
  int64_t in_stack_fffffffffffff308;
  uint *in_stack_fffffffffffff310;
  uint in_stack_fffffffffffff318;
  byte local_c89;
  RD_STATS local_c88 [25];
  int local_888 [256];
  RD_STATS local_488 [25];
  uint local_7c;
  uint local_78;
  int local_74;
  uint local_70;
  int local_6c;
  long local_68;
  uint local_54;
  long local_50;
  long local_48;
  BLOCK_SIZE local_29;
  long local_28;
  
  if (*(int *)(in_R8 + 0x15244) == 0) {
    local_50 = in_R8 + 0x24dcc;
    uVar1 = (ulong)_local_fd8 >> 0x20;
    if ((*(char *)(in_R8 + 0x24df0) == '\0') || (in_SIL < BLOCK_32X64)) {
      local_68 = in_R9 + 0x10;
      local_6c = 1;
      local_78 = (uint)""[in_SIL];
      local_7c = (uint)""[in_SIL];
      local_48 = in_R9;
      local_29 = in_SIL;
      local_28 = in_RDI;
      memset(local_488,0,0x400);
      memset(local_888,0,0x400);
      memset(local_c88,0,0x400);
      uVar5 = *(undefined4 *)(local_68 + 0x28);
      local_fa8 = local_488;
      piVar3 = local_888;
      rd_stats_00 = local_c88;
      _local_fd8 = (RD_STATS *)CONCAT44((int)uVar1,8);
      block_variance((uint8_t *)CONCAT44(in_stack_fffffffffffff054,uVar5),in_stack_fffffffffffff04c,
                     (uint8_t *)rd_stats_00,(int)((ulong)piVar3 >> 0x20),(int)piVar3,
                     (int)((ulong)local_fa8 >> 0x20),in_stack_fffffffffffff070,
                     (int *)CONCAT44(in_stack_fffffffffffff07c,in_stack_fffffffffffff078),
                     in_stack_fffffffffffff080,
                     (uint32_t *)CONCAT17(in_stack_fffffffffffff08f,in_stack_fffffffffffff088),
                     (int *)in_stack_fffffffffffff090,in_stack_fffffffffffff098);
      calculate_rd_00 = (int)((ulong)piVar3 >> 0x20);
      local_70 = local_54 -
                 (int)((long)local_74 * (long)local_74 >>
                      ((char)local_78 + (char)local_7c + 4U & 0x3f));
      if ((in_stack_00000028 == (uint *)0x0) ||
         (*in_stack_00000028 = local_70, *in_stack_00000028 <= in_stack_00000030)) {
        *(ulong *)(in_stack_00000008 + 6) = (ulong)local_54;
        *in_stack_00000010 = 0;
        local_c89 = calculate_tx_size(in_stack_fffffffffffff090,in_stack_fffffffffffff08f,
                                      (MACROBLOCK *)
                                      CONCAT44(in_stack_fffffffffffff084,in_stack_fffffffffffff080),
                                      in_stack_fffffffffffff07c,in_stack_fffffffffffff078,
                                      (int *)in_stack_fffffffffffff070);
        if (local_c89 == 0) {
          local_c89 = 1;
        }
        *(byte *)(**(long **)(local_48 + 0x1eb8) + 0x91) = local_c89;
        if (((in_stack_00000018 == 0) && (*(int *)(local_28 + 0x60db4) != 0)) &&
           (iVar2 = early_term_inter_search_with_sse
                              (*(int *)(local_28 + 0x60db4),local_29,(ulong)local_54,
                               in_stack_00000020,
                               *(PREDICTION_MODE *)(**(long **)(local_48 + 0x1eb8) + 2)), iVar2 != 0
           )) {
          local_6c = 0;
        }
        if (*in_stack_00000010 != 0) {
          local_6c = 0;
        }
        if (local_6c != 0) {
          memset(&local_d98,0,0x100);
          uVar4 = (undefined4)((ulong)rd_stats_00 >> 0x20);
          memset(local_e98,0,0x100);
          memset(local_f98,0,0x100);
          _local_fd8 = local_488;
          local_fa8 = local_c88;
          in_stack_fffffffffffff054 = 1 << (((char)local_78 + (char)local_7c) - 2U & 0x1f);
          if (1 < local_c89) {
            calculate_variance(local_78,local_7c,'\x01',(uint *)local_488,local_888,local_f98,
                               (uint *)&local_d98,local_e98);
            _local_fd8 = &local_d98;
            local_fa8 = (RD_STATS *)local_f98;
            in_stack_fffffffffffff054 = in_stack_fffffffffffff054 >> 2;
          }
          rd_stats_00 = (RD_STATS *)CONCAT44(uVar4,local_70);
          pRVar6 = _local_fd8;
          set_early_term_based_on_uv_plane
                    (in_stack_fffffffffffff0d0,in_stack_fffffffffffff0c8,in_stack_fffffffffffff0c7,
                     in_stack_fffffffffffff0b8,in_stack_fffffffffffff0b4,in_stack_fffffffffffff0b0,
                     in_stack_fffffffffffff0e0,in_stack_fffffffffffff0e8,in_stack_fffffffffffff0f0,
                     in_stack_fffffffffffff0f8,in_stack_fffffffffffff100,in_stack_fffffffffffff108,
                     in_stack_fffffffffffff110);
          in_stack_fffffffffffff060 = (uint)pRVar6;
          in_stack_fffffffffffff048 = local_54;
        }
        uVar1 = (ulong)_local_fd8 >> 0x38;
        calc_rate_dist_block_param
                  ((AV1_COMP *)CONCAT44(in_stack_fffffffffffff054,uVar5),
                   (MACROBLOCK *)CONCAT44(in_stack_fffffffffffff04c,in_stack_fffffffffffff048),
                   rd_stats_00,calculate_rd_00,&local_fa8->rate,(BLOCK_SIZE)uVar1,
                   in_stack_fffffffffffff060);
      }
    }
    else {
      *(undefined1 *)(**(long **)(in_R9 + 0x1eb8) + 0x91) = 2;
      model_skip_for_sb_y_large_64
                (in_stack_fffffffffffff2c0,in_stack_fffffffffffff2bf,in_stack_fffffffffffff2b8,
                 in_stack_fffffffffffff2b4,in_stack_fffffffffffff2a8,in_stack_fffffffffffff2a0,
                 in_stack_fffffffffffff2f0,in_stack_fffffffffffff2f8,in_stack_fffffffffffff300,
                 in_stack_fffffffffffff308,in_stack_fffffffffffff310,in_stack_fffffffffffff318);
    }
  }
  else {
    *in_stack_00000010 = 1;
    *in_stack_00000008 = 0;
    *(undefined8 *)(in_stack_00000008 + 2) = 0;
    *(undefined8 *)(in_stack_00000008 + 6) = 0;
  }
  return;
}

Assistant:

static void model_skip_for_sb_y_large(AV1_COMP *cpi, BLOCK_SIZE bsize,
                                      int mi_row, int mi_col, MACROBLOCK *x,
                                      MACROBLOCKD *xd, RD_STATS *rd_stats,
                                      int *early_term, int calculate_rd,
                                      int64_t best_sse,
                                      unsigned int *var_output,
                                      unsigned int var_prune_threshold) {
  if (x->force_zeromv_skip_for_blk) {
    *early_term = 1;
    rd_stats->rate = 0;
    rd_stats->dist = 0;
    rd_stats->sse = 0;
    return;
  }

  // For block sizes greater than 32x32, the transform size is always 16x16.
  // This function avoids calling calculate_variance() for tx_size 16x16 cases
  // by directly populating variance at tx_size level from
  // block_variance_16x16_dual() function.
  const TxfmSearchParams *txfm_params = &x->txfm_search_params;
  if (CAP_TX_SIZE_FOR_BSIZE_GT32(txfm_params->tx_mode_search_type, bsize)) {
    xd->mi[0]->tx_size = TX_SIZE_FOR_BSIZE_GT32;
    model_skip_for_sb_y_large_64(cpi, bsize, mi_row, mi_col, x, xd, rd_stats,
                                 early_term, calculate_rd, best_sse, var_output,
                                 var_prune_threshold);
    return;
  }

  // Note our transform coeffs are 8 times an orthogonal transform.
  // Hence quantizer step is also 8 times. To get effective quantizer
  // we need to divide by 8 before sending to modeling function.
  unsigned int sse;
  struct macroblock_plane *const p = &x->plane[AOM_PLANE_Y];
  struct macroblockd_plane *const pd = &xd->plane[AOM_PLANE_Y];
  int test_skip = 1;
  unsigned int var;
  int sum;

  const int bw = b_width_log2_lookup[bsize];
  const int bh = b_height_log2_lookup[bsize];
  unsigned int sse8x8[256] = { 0 };
  int sum8x8[256] = { 0 };
  unsigned int var8x8[256] = { 0 };
  TX_SIZE tx_size;

  // Calculate variance for whole partition, and also save 8x8 blocks' variance
  // to be used in following transform skipping test.
  block_variance(p->src.buf, p->src.stride, pd->dst.buf, pd->dst.stride,
                 4 << bw, 4 << bh, &sse, &sum, 8, sse8x8, sum8x8, var8x8);
  var = sse - (unsigned int)(((int64_t)sum * sum) >> (bw + bh + 4));
  if (var_output) {
    *var_output = var;
    if (*var_output > var_prune_threshold) {
      return;
    }
  }

  rd_stats->sse = sse;
  // Skipping test
  *early_term = 0;
  tx_size = calculate_tx_size(cpi, bsize, x, var, sse, early_term);
  assert(tx_size <= TX_16X16);
  // The code below for setting skip flag assumes transform size of at least
  // 8x8, so force this lower limit on transform.
  if (tx_size < TX_8X8) tx_size = TX_8X8;
  xd->mi[0]->tx_size = tx_size;

  MB_MODE_INFO *const mi = xd->mi[0];
  if (!calculate_rd && cpi->sf.rt_sf.sse_early_term_inter_search &&
      early_term_inter_search_with_sse(
          cpi->sf.rt_sf.sse_early_term_inter_search, bsize, sse, best_sse,
          mi->mode))
    test_skip = 0;

  if (*early_term) test_skip = 0;

  // Evaluate if the partition block is a skippable block in Y plane.
  if (test_skip) {
    unsigned int sse16x16[64] = { 0 };
    int sum16x16[64] = { 0 };
    unsigned int var16x16[64] = { 0 };
    const unsigned int *sse_tx = sse8x8;
    const unsigned int *var_tx = var8x8;
    unsigned int num_blks = 1 << (bw + bh - 2);

    if (tx_size >= TX_16X16) {
      calculate_variance(bw, bh, TX_8X8, sse8x8, sum8x8, var16x16, sse16x16,
                         sum16x16);
      sse_tx = sse16x16;
      var_tx = var16x16;
      num_blks = num_blks >> 2;
    }
    set_early_term_based_on_uv_plane(cpi, x, bsize, xd, mi_row, mi_col,
                                     early_term, num_blks, sse_tx, var_tx, sum,
                                     var, sse);
  }
  calc_rate_dist_block_param(cpi, x, rd_stats, calculate_rd, early_term, bsize,
                             sse);
}